

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

size_t __thiscall
edition_unittest::TestNestedRequiredForeign::ByteSizeLong(TestNestedRequiredForeign *this)

{
  long lVar1;
  anon_union_64_1_493b367e_for_TestNestedRequiredForeign_3 aVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  
  aVar2 = this->field_0;
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x7f) == (undefined1  [64])0x0) {
    sVar5 = 0;
  }
  else {
    if (((undefined1  [64])aVar2 & (undefined1  [64])0x1) == (undefined1  [64])0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestNestedRequiredForeign>
                        ((this->field_0)._impl_.child_);
      sVar5 = sVar5 + 1;
    }
    if (((undefined1  [64])aVar2 & (undefined1  [64])0x2) != (undefined1  [64])0x0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestRequiredForeign>((this->field_0)._impl_.payload_);
      sVar5 = sVar5 + sVar3 + 1;
    }
    if (((undefined1  [64])aVar2 & (undefined1  [64])0x4) != (undefined1  [64])0x0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestRequiredEnum>((this->field_0)._impl_.required_enum_)
      ;
      sVar5 = sVar5 + sVar3 + 1;
    }
    if (((undefined1  [64])aVar2 & (undefined1  [64])0x8) != (undefined1  [64])0x0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestRequiredEnumNoMask>
                        ((this->field_0)._impl_.required_enum_no_mask_);
      sVar5 = sVar5 + sVar3 + 1;
    }
    if (((undefined1  [64])aVar2 & (undefined1  [64])0x10) != (undefined1  [64])0x0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestRequiredEnumMulti>
                        ((this->field_0)._impl_.required_enum_multi_);
      sVar5 = sVar5 + sVar3 + 1;
    }
    if (((undefined1  [64])aVar2 & (undefined1  [64])0x20) != (undefined1  [64])0x0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestRequiredNoMaskMulti>
                        ((this->field_0)._impl_.required_no_mask_);
      sVar5 = sVar5 + sVar3 + 1;
    }
    if (((undefined1  [64])aVar2 & (undefined1  [64])0x40) != (undefined1  [64])0x0) {
      uVar4 = (long)(this->field_0)._impl_.dummy_ | 1;
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t TestNestedRequiredForeign::ByteSizeLong() const {
  const TestNestedRequiredForeign& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestNestedRequiredForeign)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    // .edition_unittest.TestNestedRequiredForeign child = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.child_);
    }
    // .edition_unittest.TestRequiredForeign payload = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.payload_);
    }
    // .edition_unittest.TestRequiredEnum required_enum = 5;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_enum_);
    }
    // .edition_unittest.TestRequiredEnumNoMask required_enum_no_mask = 6;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_enum_no_mask_);
    }
    // .edition_unittest.TestRequiredEnumMulti required_enum_multi = 7;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_enum_multi_);
    }
    // .edition_unittest.TestRequiredNoMaskMulti required_no_mask = 9;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_no_mask_);
    }
    // int32 dummy = 3;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}